

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void build_obmc_prediction
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *above_mbmi,void *fun_ctxt,int num_planes)

{
  MV_REFERENCE_FRAME ref_frame;
  BLOCK_SIZE bsize;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  AV1_COMMON *cm;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  RefCntBuffer *pRVar11;
  scale_factors *sf;
  byte bVar12;
  uint uVar13;
  buf_2d *ref_buf;
  ulong uVar14;
  int *piVar15;
  int y;
  int x;
  MV mv;
  InterPredParams local_108;
  
  uVar13._0_1_ = above_mbmi->bsize;
  uVar13._1_1_ = above_mbmi->partition;
  uVar13._2_1_ = above_mbmi->mode;
  uVar13._3_1_ = above_mbmi->uv_mode;
  uVar9 = (ulong)uVar13;
  if ((byte)(undefined1)uVar13 < 4) {
    uVar9 = 3;
  }
  iVar1 = xd->mi_row;
  iVar2 = xd->mi_col;
  uVar14 = 0;
  uVar10 = 0;
  if (0 < num_planes) {
    uVar10 = (ulong)(uint)num_planes;
  }
  piVar15 = &xd->plane[0].dst.stride;
  for (; uVar10 != uVar14; uVar14 = uVar14 + 1) {
    puVar5 = *(uint8_t **)(*(long *)((long)fun_ctxt + 8) + uVar14 * 8);
    iVar8 = *(int *)(*(long *)((long)fun_ctxt + 0x10) + uVar14 * 4);
    iVar3 = *(int *)(*(long *)((long)fun_ctxt + 0x18) + uVar14 * 4);
    iVar4 = *(int *)(*(long *)((long)fun_ctxt + 0x20) + uVar14 * 4);
    uVar13 = (uint)((0x20005UL >> (uVar9 & 0x3f) & 1) != 0);
    if (piVar15[-8] == 0) {
      uVar13 = 0;
    }
    uVar6 = (uint)((0x10003UL >> (uVar9 & 0x3f) & 1) != 0);
    if (piVar15[-9] == 0) {
      uVar6 = 0;
    }
    ((buf_2d *)(piVar15 + -6))->buf =
         puVar5 + (long)((int)((~uVar13 & rel_mi_row) << 2) >> ((byte)piVar15[-8] & 0x1f)) *
                  (long)iVar4 +
                  (long)((int)((~uVar6 & rel_mi_col) << 2) >> ((byte)piVar15[-9] & 0x1f));
    *(uint8_t **)(piVar15 + -4) = puVar5;
    piVar15[-2] = iVar8;
    piVar15[-1] = iVar3;
    *piVar15 = iVar4;
    piVar15 = piVar15 + 0x28c;
  }
  ref_frame = above_mbmi->ref_frame[0];
  cm = *fun_ctxt;
  pRVar11 = get_ref_frame_buf(cm,ref_frame);
  sf = get_ref_scale_factors_const(cm,ref_frame);
  xd->block_ref_scale_factors[0] = sf;
  if ((sf->x_scale_fp == -1) || (sf->y_scale_fp == -1)) {
    aom_internal_error(xd->error_info,AOM_CODEC_UNSUP_BITSTREAM,
                       "Reference frame has invalid dimensions");
  }
  av1_setup_pre_planes(xd,0,&pRVar11->buf,iVar1 + rel_mi_row,iVar2 + rel_mi_col,sf,num_planes);
  iVar1 = xd->mi_col;
  iVar2 = xd->mi_row;
  bsize = (*xd->mi)->bsize;
  ref_buf = xd->plane[0].pre;
  for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    if (dir == 0) {
      uVar13 = ((uint)op_mi_size << 2) >> ((byte)ref_buf[-2].height & 0x1f);
      bVar12 = (char)ref_buf[-2].stride + 1;
      uVar7 = (uint)(block_size_high[bsize] >> (bVar12 & 0x1f));
      uVar6 = 0x40 >> (bVar12 & 0x1f);
      if (uVar7 < uVar6) {
        uVar6 = uVar7;
      }
      if (uVar7 < 4) {
        uVar6 = 4;
      }
    }
    else {
      bVar12 = (char)ref_buf[-2].height + 1;
      uVar6 = (uint)(block_size_wide[bsize] >> (bVar12 & 0x1f));
      uVar13 = 0x40 >> (bVar12 & 0x1f);
      if (uVar6 < uVar13) {
        uVar13 = uVar6;
      }
      if (uVar6 < 4) {
        uVar13 = 4;
      }
      uVar6 = ((uint)op_mi_size << 2) >> ((byte)ref_buf[-2].stride & 0x1f);
    }
    iVar8 = av1_skip_u4x4_pred_in_obmc(bsize,(macroblockd_plane *)&ref_buf[-2].width,dir);
    if (iVar8 == 0) {
      mv = above_mbmi->mv[0].as_mv;
      av1_init_inter_params
                (&local_108,uVar13,uVar6,
                 (rel_mi_row + iVar2) * 4 >> ((byte)ref_buf[-2].stride & 0x1f),
                 (rel_mi_col + iVar1) * 4 >> ((byte)ref_buf[-2].height & 0x1f),ref_buf[-2].height,
                 ref_buf[-2].stride,xd->bd,(uint)xd->cur_buf->flags >> 3 & 1,0,
                 xd->block_ref_scale_factors[0],ref_buf,above_mbmi->interp_filters);
      iVar8 = xd->bd;
      local_108.conv_params.round_0 = iVar8 + -7;
      local_108.conv_params.round_1 = 0x15 - iVar8;
      if (iVar8 < 0xb) {
        local_108.conv_params.round_0 = 3;
        local_108.conv_params.round_1 = 0xb;
      }
      local_108.conv_params.do_average = 0;
      local_108.conv_params.dst = (CONV_BUF_TYPE *)0x0;
      local_108.conv_params.dst_stride = 0;
      local_108.conv_params.plane = (int)uVar9;
      local_108.conv_params.is_compound = 0;
      local_108.conv_params.use_dist_wtd_comp_avg = 0;
      build_one_inter_predictor(ref_buf[-1].buf,ref_buf[-1].stride,&mv,&local_108);
    }
    ref_buf = (buf_2d *)&ref_buf[0x51].width;
  }
  return;
}

Assistant:

static inline void build_obmc_prediction(MACROBLOCKD *xd, int rel_mi_row,
                                         int rel_mi_col, uint8_t op_mi_size,
                                         int dir, MB_MODE_INFO *above_mbmi,
                                         void *fun_ctxt, const int num_planes) {
  struct build_prediction_ctxt *ctxt = (struct build_prediction_ctxt *)fun_ctxt;
  setup_address_for_obmc(xd, rel_mi_row, rel_mi_col, above_mbmi, ctxt,
                         num_planes);

  const int mi_x = (xd->mi_col + rel_mi_col) << MI_SIZE_LOG2;
  const int mi_y = (xd->mi_row + rel_mi_row) << MI_SIZE_LOG2;

  const BLOCK_SIZE bsize = xd->mi[0]->bsize;

  InterPredParams inter_pred_params;

  for (int j = 0; j < num_planes; ++j) {
    const struct macroblockd_plane *pd = &xd->plane[j];
    int bw = 0, bh = 0;

    if (dir) {
      // prepare left reference block size
      bw = clamp(block_size_wide[bsize] >> (pd->subsampling_x + 1), 4,
                 block_size_wide[BLOCK_64X64] >> (pd->subsampling_x + 1));
      bh = (op_mi_size << MI_SIZE_LOG2) >> pd->subsampling_y;
    } else {
      // prepare above reference block size
      bw = (op_mi_size * MI_SIZE) >> pd->subsampling_x;
      bh = clamp(block_size_high[bsize] >> (pd->subsampling_y + 1), 4,
                 block_size_high[BLOCK_64X64] >> (pd->subsampling_y + 1));
    }

    if (av1_skip_u4x4_pred_in_obmc(bsize, pd, dir)) continue;

    const struct buf_2d *const pre_buf = &pd->pre[0];
    const MV mv = above_mbmi->mv[0].as_mv;

    av1_init_inter_params(&inter_pred_params, bw, bh, mi_y >> pd->subsampling_y,
                          mi_x >> pd->subsampling_x, pd->subsampling_x,
                          pd->subsampling_y, xd->bd, is_cur_buf_hbd(xd), 0,
                          xd->block_ref_scale_factors[0], pre_buf,
                          above_mbmi->interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, j, xd->bd);

    av1_enc_build_one_inter_predictor(pd->dst.buf, pd->dst.stride, &mv,
                                      &inter_pred_params);
  }
}